

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O2

void __thiscall
ParseNodeProg::ParseNodeProg(ParseNodeProg *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  ParseNodeFnc::ParseNodeFnc(&this->super_ParseNodeFnc,nop,ichMin,ichLim);
  this->pnodeLastValStmt = (ParseNodePtr)0x0;
  this->m_UsesArgumentsAtGlobal = false;
  return;
}

Assistant:

ParseNodeProg::ParseNodeProg(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeFnc(nop, ichMin, ichLim)
{
    this->pnodeLastValStmt = nullptr;
    this->m_UsesArgumentsAtGlobal = false;
}